

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gregocal.cpp
# Opt level: O3

int32_t __thiscall
icu_63::GregorianCalendar::handleGetMonthLength
          (GregorianCalendar *this,int32_t extendedYear,int32_t month)

{
  int32_t iVar1;
  uint uVar2;
  int8_t *piVar3;
  int32_t local_14;
  
  local_14 = month;
  if (0xb < (uint)month) {
    iVar1 = ClockMath::floorDivide((double)month,0xc,&local_14);
    extendedYear = extendedYear + iVar1;
  }
  if ((extendedYear < this->fGregorianCutoverYear) || ((extendedYear & 3U) != 0)) {
    if (this->fGregorianCutoverYear <= extendedYear || (extendedYear & 3U) != 0) goto LAB_001ed564;
  }
  else {
    uVar2 = extendedYear * -0x3d70a3d7 + 0x51eb850;
    if (((uVar2 >> 2 | extendedYear * 0x40000000) < 0x28f5c29) &&
       (0xa3d70a < (uVar2 >> 4 | extendedYear * -0x70000000))) {
LAB_001ed564:
      piVar3 = "\x1f\x1c\x1f\x1e\x1f\x1e\x1f\x1f\x1e\x1f\x1e\x1f";
      goto LAB_001ed56b;
    }
  }
  piVar3 = "\x1f\x1d\x1f\x1e\x1f\x1e\x1f\x1f\x1e\x1f\x1e\x1f";
LAB_001ed56b:
  return (int)piVar3[local_14];
}

Assistant:

int32_t GregorianCalendar::handleGetMonthLength(int32_t extendedYear, int32_t month)  const
{
    // If the month is out of range, adjust it into range, and
    // modify the extended year value accordingly.
    if (month < 0 || month > 11) {
        extendedYear += ClockMath::floorDivide(month, 12, month);
    }

    return isLeapYear(extendedYear) ? kLeapMonthLength[month] : kMonthLength[month];
}